

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_options.h
# Opt level: O1

float __thiscall
draco::DracoOptions<int>::GetAttributeFloat
          (DracoOptions<int> *this,AttributeKey *att_key,string *name,float default_val)

{
  DracoOptions<int> *this_00;
  const_iterator cVar1;
  float fVar2;
  
  this_00 = (DracoOptions<int> *)FindAttributeOptions(this,att_key);
  if (this_00 != (DracoOptions<int> *)0x0) {
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)this_00,name);
    if ((_Rb_tree_header *)cVar1._M_node !=
        &(this_00->global_options_).options_._M_t._M_impl.super__Rb_tree_header) goto LAB_0016bd64;
  }
  this_00 = this;
LAB_0016bd64:
  fVar2 = Options::GetFloat(&this_00->global_options_,name,default_val);
  return fVar2;
}

Assistant:

float DracoOptions<AttributeKeyT>::GetAttributeFloat(
    const AttributeKeyT &att_key, const std::string &name,
    float default_val) const {
  const Options *const att_options = FindAttributeOptions(att_key);
  if (att_options && att_options->IsOptionSet(name)) {
    return att_options->GetFloat(name, default_val);
  }
  return global_options_.GetFloat(name, default_val);
}